

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLinOp::AnyInterpolationAmr
          (MLNodeLinOp *this,int famrlev,Any *a_fine,Any *a_crse,IntVect *nghost)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  MFIter mfi;
  ulong local_1e8;
  Box local_188;
  ulong local_160;
  int local_154;
  FabArray<amrex::FArrayBox> *local_150;
  ulong local_148;
  FabArray<amrex::FArrayBox> *local_140;
  IntVect *local_138;
  long local_130;
  double *local_128;
  double *local_120;
  ulong local_118;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  local_138 = nghost;
  local_150 = &Any::get<amrex::MultiFab>(a_fine)->super_FabArray<amrex::FArrayBox>;
  local_140 = &Any::get<amrex::MultiFab>(a_crse)->super_FabArray<amrex::FArrayBox>;
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  iVar1 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(long)famrlev + -1];
  if ((iVar1 != 2) && (iVar1 != 4)) {
    Assert_host("refratio == 2 || refratio == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x1ed,(char *)0x0);
  }
  MFIter::MFIter(&local_90,&local_150->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_148 = (ulong)uVar2;
    do {
      MFIter::tilebox(&local_188,&local_90);
      iVar12 = (int)((ulong)*(undefined8 *)(local_138->vect + 1) >> 0x20);
      iVar7 = (int)*(undefined8 *)(local_138->vect + 1);
      local_188.bigend.vect[0] = local_138->vect[0] + local_188.bigend.vect[0];
      local_188.smallend.vect[0] = local_188.smallend.vect[0] - local_138->vect[0];
      local_188.smallend.vect[1] = local_188.smallend.vect[1] - iVar7;
      local_188.smallend.vect[2] = local_188.smallend.vect[2] - iVar12;
      iVar3 = local_188.bigend.vect[2];
      local_188.bigend.vect[1] = local_188.bigend.vect[1] + iVar7;
      local_188.bigend.vect[2] = iVar3 + iVar12;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,local_150,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_140,&local_90);
      if (iVar1 == 2) {
        if (0 < (int)uVar2) {
          local_1e8 = 0;
          do {
            uVar15 = local_188.smallend.vect[2];
            if (local_188.smallend.vect[2] <= local_188.bigend.vect[2]) {
              do {
                if (local_188.smallend.vect[1] <= local_188.bigend.vect[1]) {
                  iVar3 = (int)uVar15 >> 1;
                  uVar21 = local_188.smallend.vect[1];
                  do {
                    if (local_188.smallend.vect[0] <= local_188.bigend.vect[0]) {
                      iVar7 = ((int)uVar21 >> 1) - local_110.begin.y;
                      lVar8 = local_110.jstride * iVar7;
                      lVar20 = (iVar3 - local_110.begin.z) * local_110.kstride;
                      lVar9 = (iVar7 + 1) * local_110.jstride;
                      lVar4 = local_110.nstride * local_1e8;
                      lVar6 = ((iVar3 + 1) - local_110.begin.z) * local_110.kstride;
                      uVar13 = (long)local_188.smallend.vect[0];
                      do {
                        bVar23 = (uVar21 & 1) == 0;
                        iVar7 = (int)uVar13 >> 1;
                        bVar24 = (uVar13 & 1) == 0;
                        if ((bVar24 || bVar23) || ((uVar15 & 1) == 0)) {
                          if ((uVar21 & 1) == 0 || ((long)(int)uVar15 & 1U) == 0) {
                            iVar7 = iVar7 - local_110.begin.x;
                            lVar10 = (long)iVar7;
                            if (((uVar13 & 1) != 0) && ((uVar15 & 1) != 0)) {
                              dVar25 = local_110.p[lVar8 + lVar10 + lVar20 + lVar4] +
                                       local_110.p[lVar8 + lVar10 + lVar6 + lVar4];
                              lVar10 = lVar8 + (iVar7 + 1);
                              goto LAB_007435d3;
                            }
                            if (bVar24 || bVar23) {
                              if ((uVar13 & 1) == 0) {
                                if ((uVar21 & 1) == 0) {
                                  if ((uVar15 & 1) == 0) {
                                    dVar25 = local_110.p
                                             [((long)((int)uVar21 >> 1) - (long)local_110.begin.y) *
                                              local_110.jstride +
                                              ((long)iVar3 - (long)local_110.begin.z) *
                                              local_110.kstride + lVar4 + lVar10];
                                    goto LAB_007435e9;
                                  }
                                  dVar25 = local_110.p[lVar8 + lVar10 + lVar20 + lVar4] +
                                           local_110.p[lVar8 + lVar10 + lVar6 + lVar4];
                                }
                                else {
                                  dVar25 = local_110.p[lVar8 + lVar20 + lVar4 + lVar10] +
                                           local_110.p[lVar9 + lVar20 + lVar4 + lVar10];
                                }
                              }
                              else {
                                dVar25 = local_110.p[lVar8 + lVar20 + lVar4 + lVar10] +
                                         local_110.p[lVar8 + lVar20 + lVar4 + (iVar7 + 1)];
                              }
                              dVar25 = dVar25 * 0.5;
                              goto LAB_007435e9;
                            }
                            dVar25 = local_110.p[lVar8 + lVar20 + lVar4 + lVar10] +
                                     local_110.p[lVar9 + lVar20 + lVar4 + lVar10] +
                                     local_110.p[lVar8 + lVar20 + lVar4 + (iVar7 + 1)] +
                                     local_110.p[lVar9 + lVar20 + lVar4 + (iVar7 + 1)];
                          }
                          else {
                            lVar10 = (long)(iVar7 - local_110.begin.x);
                            dVar25 = local_110.p[lVar8 + lVar10 + lVar20 + lVar4] +
                                     local_110.p[lVar8 + lVar10 + lVar6 + lVar4];
                            lVar10 = lVar9 + lVar10;
LAB_007435d3:
                            dVar25 = dVar25 + (local_110.p + lVar10)[lVar20 + lVar4] +
                                     (local_110.p + lVar10)[lVar6 + lVar4];
                          }
                          dVar25 = dVar25 * 0.25;
                        }
                        else {
                          lVar10 = (long)(iVar7 - local_110.begin.x);
                          lVar11 = (long)((iVar7 - local_110.begin.x) + 1);
                          dVar25 = (local_110.p[lVar8 + lVar10 + lVar20 + lVar4] +
                                    local_110.p[lVar8 + lVar10 + lVar6 + lVar4] +
                                    local_110.p[lVar9 + lVar10 + lVar20 + lVar4] +
                                    local_110.p[lVar9 + lVar10 + lVar6 + lVar4] +
                                    local_110.p[lVar8 + lVar11 + lVar20 + lVar4] +
                                    local_110.p[lVar8 + lVar11 + lVar6 + lVar4] +
                                    local_110.p[lVar9 + lVar11 + lVar20 + lVar4] +
                                   local_110.p[lVar9 + lVar11 + lVar6 + lVar4]) * 0.125;
                        }
LAB_007435e9:
                        local_d0.p
                        [((long)(int)uVar21 - (long)local_d0.begin.y) * local_d0.jstride +
                         ((long)(int)uVar15 - (long)local_d0.begin.z) * local_d0.kstride +
                         local_d0.nstride * local_1e8 + (uVar13 - (long)local_d0.begin.x)] = dVar25;
                        uVar13 = uVar13 + 1;
                      } while (local_188.bigend.vect[0] + 1 != (int)uVar13);
                    }
                    bVar23 = uVar21 != local_188.bigend.vect[1];
                    uVar21 = uVar21 + 1;
                  } while (bVar23);
                }
                bVar23 = uVar15 != local_188.bigend.vect[2];
                uVar15 = uVar15 + 1;
              } while (bVar23);
            }
            local_1e8 = local_1e8 + 1;
          } while (local_1e8 != local_148);
        }
      }
      else if (0 < (int)uVar2) {
        local_160 = 0;
        do {
          uVar15 = local_188.smallend.vect[2];
          if (local_188.smallend.vect[2] <= local_188.bigend.vect[2]) {
            do {
              if (local_188.smallend.vect[1] <= local_188.bigend.vect[1]) {
                uVar5 = (int)uVar15 >> 2;
                local_118 = (ulong)uVar5;
                uVar22 = uVar15 & 3;
                iVar3 = (uVar5 * 4 + 4) - uVar15;
                local_154 = uVar5 + 1;
                uVar21 = local_188.smallend.vect[1];
                do {
                  if (local_188.smallend.vect[0] <= local_188.bigend.vect[0]) {
                    iVar7 = (int)uVar21 >> 2;
                    uVar18 = uVar21 & 3;
                    lVar6 = (iVar7 - local_110.begin.y) * local_110.jstride;
                    iVar12 = (iVar7 * 4 + 4) - uVar21;
                    lVar8 = (int)(uVar5 - local_110.begin.z) * local_110.kstride;
                    lVar20 = local_110.nstride * local_160;
                    lVar9 = (local_154 - local_110.begin.z) * local_110.kstride;
                    lVar4 = ((iVar7 + 1) - local_110.begin.y) * local_110.jstride;
                    uVar13 = (long)local_188.smallend.vect[0];
                    do {
                      uVar14 = (uint)uVar13;
                      iVar7 = (int)uVar14 >> 2;
                      uVar16 = uVar14 & 3;
                      bVar23 = (uVar13 & 3) != 0;
                      bVar24 = (uVar21 & 3) != 0;
                      if ((bVar23 || bVar24) || ((uVar15 & 3) != 0)) {
                        if (bVar23 || bVar24) {
                          lVar10 = (long)(iVar7 - local_110.begin.x);
                          if ((uVar13 & 3) == 0 && (uVar15 & 3) == 0) {
                            dVar26 = local_110.p[lVar4 + lVar8 + lVar20 + lVar10] * (double)uVar18;
                            dVar25 = local_110.p[lVar6 + lVar8 + lVar20 + lVar10] * (double)iVar12;
                          }
                          else {
                            if ((uVar21 & 3) != 0 || (uVar15 & 3) != 0) {
                              if ((uVar13 & 3) == 0) {
                                dVar25 = local_110.p[lVar4 + lVar10 + lVar9 + lVar20] *
                                         (double)(uVar18 * uVar22) +
                                         local_110.p[lVar6 + lVar10 + lVar9 + lVar20] *
                                         (double)(int)(iVar12 * uVar22) +
                                         local_110.p[lVar6 + lVar10 + lVar8 + lVar20] *
                                         (double)(iVar12 * iVar3) +
                                         local_110.p[lVar4 + lVar10 + lVar8 + lVar20] *
                                         (double)(int)(uVar18 * iVar3);
                              }
                              else {
                                if ((uVar21 & 3) != 0) {
                                  if ((uVar15 & 3) == 0) {
                                    iVar17 = (iVar7 * 4 + 4) - uVar14;
                                    lVar11 = (long)((iVar7 + 1) - local_110.begin.x);
                                    dVar25 = ((double)(uVar16 * uVar18) *
                                              local_110.p[lVar4 + lVar8 + lVar20 + lVar11] +
                                             (double)(int)(iVar17 * uVar18) *
                                             local_110.p[lVar4 + lVar8 + lVar20 + lVar10] +
                                             (double)(iVar17 * iVar12) *
                                             local_110.p[lVar6 + lVar8 + lVar20 + lVar10] +
                                             (double)(int)(uVar16 * iVar12) *
                                             local_110.p[lVar6 + lVar8 + lVar20 + lVar11]) * 0.0625;
                                  }
                                  else {
                                    iVar19 = (iVar7 * 4 + 4) - uVar14;
                                    iVar17 = iVar19 * iVar12;
                                    local_130 = (long)((iVar7 + 1) - local_110.begin.x);
                                    local_120 = local_110.p + lVar6 + local_130;
                                    local_128 = local_110.p + lVar4 + lVar10;
                                    iVar19 = iVar19 * uVar18;
                                    dVar25 = ((double)(uVar16 * uVar18 * uVar22) *
                                              local_110.p[lVar4 + local_130 + lVar9 + lVar20] +
                                             (double)(int)(iVar19 * uVar22) *
                                             local_128[lVar9 + lVar20] +
                                             (double)(int)(uVar16 * iVar12 * uVar22) *
                                             local_120[lVar9 + lVar20] +
                                             (double)(int)(iVar17 * uVar22) *
                                             local_110.p[lVar6 + lVar10 + lVar9 + lVar20] +
                                             (double)(int)(uVar16 * uVar18 * iVar3) *
                                             local_110.p[lVar4 + local_130 + lVar8 + lVar20] +
                                             (double)(iVar19 * iVar3) * local_128[lVar8 + lVar20] +
                                             (double)(iVar17 * iVar3) *
                                             local_110.p[lVar6 + lVar10 + lVar8 + lVar20] +
                                             (double)(int)(uVar16 * iVar12 * iVar3) *
                                             local_120[lVar8 + lVar20]) * 0.015625;
                                  }
                                  goto LAB_00743be9;
                                }
                                iVar17 = (iVar7 * 4 + 4) - uVar14;
                                lVar11 = (long)((iVar7 + 1) - local_110.begin.x);
                                dVar25 = (double)(uVar16 * uVar22) *
                                         local_110.p[lVar6 + lVar11 + lVar9 + lVar20] +
                                         (double)(int)(iVar17 * uVar22) *
                                         local_110.p[lVar6 + lVar10 + lVar9 + lVar20] +
                                         (double)(iVar17 * iVar3) *
                                         local_110.p[lVar6 + lVar10 + lVar8 + lVar20] +
                                         (double)(int)(uVar16 * iVar3) *
                                         local_110.p[lVar6 + lVar11 + lVar8 + lVar20];
                              }
                              dVar25 = dVar25 * 0.0625;
                              goto LAB_00743be9;
                            }
                            dVar26 = (double)uVar16 *
                                     local_110.p
                                     [lVar6 + lVar8 + lVar20 + ((iVar7 + 1) - local_110.begin.x)];
                            dVar25 = (double)(int)((iVar7 * 4 + 4) - uVar14) *
                                     local_110.p[lVar6 + lVar8 + lVar20 + lVar10];
                          }
                        }
                        else {
                          dVar26 = local_110.p
                                   [lVar6 + (long)(iVar7 - local_110.begin.x) + lVar9 + lVar20] *
                                   (double)uVar22;
                          dVar25 = local_110.p
                                   [lVar6 + (long)(iVar7 - local_110.begin.x) + lVar8 + lVar20] *
                                   (double)iVar3;
                        }
                        dVar25 = (dVar25 + dVar26) * 0.25;
                      }
                      else {
                        dVar25 = local_110.p[lVar6 + lVar8 + lVar20 + (iVar7 - local_110.begin.x)];
                      }
LAB_00743be9:
                      local_d0.p
                      [((long)(int)uVar21 - (long)local_d0.begin.y) * local_d0.jstride +
                       ((long)(int)uVar15 - (long)local_d0.begin.z) * local_d0.kstride +
                       local_d0.nstride * local_160 + (uVar13 - (long)local_d0.begin.x)] = dVar25;
                      uVar13 = uVar13 + 1;
                    } while ((int)uVar13 != local_188.bigend.vect[0] + 1);
                  }
                  bVar23 = uVar21 != local_188.bigend.vect[1];
                  uVar21 = uVar21 + 1;
                } while (bVar23);
              }
              bVar23 = uVar15 != local_188.bigend.vect[2];
              uVar15 = uVar15 + 1;
            } while (bVar23);
          }
          local_160 = local_160 + 1;
        } while (local_160 != local_148);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLinOp::AnyInterpolationAmr (int famrlev, Any& a_fine, const Any& a_crse,
                                  IntVect const& nghost) const
{
    AMREX_ASSERT(a_fine.is<MultiFab>());
    MultiFab& fine = a_fine.get<MultiFab>();
    MultiFab const& crse = a_crse.get<MultiFab>();

    const int ncomp = getNComp();
    const int refratio = AMRRefRatio(famrlev-1);

    AMREX_ALWAYS_ASSERT(refratio == 2 || refratio == 4);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        Box fbx = mfi.tilebox();
        fbx.grow(nghost);
        Array4<Real> const& ffab = fine.array(mfi);
        Array4<Real const> const& cfab = crse.const_array(mfi);

        if (refratio == 2) {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r2(i,j,k,n,ffab,cfab);
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r4(i,j,k,n,ffab,cfab);
            });
        }
    }
}